

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLi(Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,
                   int flags)

{
  Expression *this;
  undefined4 in_register_0000000c;
  MipsImmediateData *immediates_00;
  long lVar1;
  char *__s;
  uint in_R8D;
  char *__s_00;
  initializer_list<AssemblyTemplateArgument> variables;
  allocator<char> local_102;
  allocator<char> local_101;
  string macroText;
  ExpressionValue value;
  string local_a0 [32];
  char *local_80;
  string local_78 [32];
  char *local_58;
  string local_50;
  
  immediates_00 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  this = &(immediates_00->secondary).expression;
  if ((immediates_00->secondary).expression.constExpression == true) {
    Expression::evaluate(&value,this);
    if (value.type == Float) {
      getFloatBits((float)value.field_1.floatValue);
      createConstExpression((int64_t)parser);
      Expression::operator=(this,(Expression *)&macroText);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&macroText._M_string_length);
    }
    std::__cxx11::string::~string((string *)&value.strValue);
  }
  preprocessMacro_abi_cxx11_
            (&macroText,
             "\n\t\t.if abs(%imm%) > 0xFFFFFFFF\n\t\t\t.error \"Immediate value too big\"\n\t\t.elseif %imm% & ~0xFFFF\n\t\t\t.if (%imm% & 0xFFFF8000) == 0xFFFF8000\n\t\t\t\t.if %lower%\n\t\t\t\t\taddiu\t%rs%,r0, lo(%imm%)\n\t\t\t\t.endif\n\t\t\t.elseif (%imm% & 0xFFFF) == 0\n\t\t\t\t.if %upper%\n\t\t\t\t\tlui\t\t%rs%, hi(%imm%)\n\t\t\t\t.elseif %lower%\n\t\t\t\t\tnop\n\t\t\t\t.endif\n\t\t\t.else\n\t\t\t\t.if %upper%\n\t\t\t\t\tlui\t\t%rs%, hi(%imm%)\n\t\t\t\t.endif\n\t\t\t\t.if %lower%\n\t\t\t\t\taddiu \t%rs%, lo(%imm%)\n\t\t\t\t.endif\n\t\t\t.endif\n\t\t.else\n\t\t\t.if %lower%\n\t\t\t\tori\t\t%rs%,r0,%imm%\n\t\t\t.endif\n\t\t.endif\n\t"
             ,immediates_00);
  value._0_8_ = anon_var_dwarf_32297a;
  __s_00 = "1";
  __s = "1";
  if ((in_R8D >> 0xe & 1) == 0) {
    __s = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&value.field_1,__s,&local_101);
  value.strValue._value.field_2._8_8_ = anon_var_dwarf_3229a9;
  if (-1 < (short)in_R8D) {
    __s_00 = "0";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_a0,__s_00,&local_102);
  local_80 = "%rs%";
  std::__cxx11::string::string(local_78,(string *)&(immediates->primary).expression);
  local_58 = "%imm%";
  Expression::toString_abi_cxx11_(&local_50,this);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&value;
  createMacro(parser,(string *)registers,(int)&macroText,variables);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string(local_a0 + lVar1 + -0x30);
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLi(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLi = R"(
		.if abs(%imm%) > 0xFFFFFFFF
			.error "Immediate value too big"
		.elseif %imm% & ~0xFFFF
			.if (%imm% & 0xFFFF8000) == 0xFFFF8000
				.if %lower%
					addiu	%rs%,r0, lo(%imm%)
				.endif
			.elseif (%imm% & 0xFFFF) == 0
				.if %upper%
					lui		%rs%, hi(%imm%)
				.elseif %lower%
					nop
				.endif
			.else
				.if %upper%
					lui		%rs%, hi(%imm%)
				.endif
				.if %lower%
					addiu 	%rs%, lo(%imm%)
				.endif
			.endif
		.else
			.if %lower%
				ori		%rs%,r0,%imm%
			.endif
		.endif
	)";

	// floats need to be treated as integers, convert them
	if (immediates.secondary.expression.isConstExpression())
	{
		ExpressionValue value = immediates.secondary.expression.evaluate();
		if (value.isFloat())
		{
			int32_t newValue = getFloatBits((float)value.floatValue);
			immediates.secondary.expression = createConstExpression(newValue);
		}
	}

	std::string macroText = preprocessMacro(templateLi,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%upper%",	(flags & MIPSM_UPPER) ? "1" : "0" },
			{ "%lower%",	(flags & MIPSM_LOWER) ? "1" : "0" },
			{ "%rs%",		registers.grs.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
	});
}